

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_cmp_joliet_identifier(isoent *p1,isoent *p2)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  uchar *puVar6;
  long lVar7;
  int local_38;
  uint local_34;
  int l;
  int cmp;
  uchar *s2;
  uchar *s1;
  isoent *p2_local;
  isoent *p1_local;
  
  pcVar3 = p1->identifier;
  pcVar4 = p2->identifier;
  local_38 = p1->ext_off;
  if (p2->ext_off < local_38) {
    local_38 = p2->ext_off;
  }
  local_34 = memcmp(pcVar3,pcVar4,(long)local_38);
  p1_local._4_4_ = local_34;
  if (local_34 == 0) {
    if (p1->ext_off < p2->ext_off) {
      lVar7 = (long)local_38;
      local_38 = p2->ext_off - p1->ext_off;
      pbVar5 = (byte *)(pcVar4 + lVar7);
      do {
        _l = pbVar5;
        if (local_38 == 0) goto LAB_007ec526;
        local_38 = local_38 + -1;
        pbVar5 = _l + 1;
      } while (*_l == 0);
      p1_local._4_4_ = -(uint)*_l;
    }
    else if (p2->ext_off < p1->ext_off) {
      lVar7 = (long)local_38;
      local_38 = p1->ext_off - p2->ext_off;
      puVar6 = (uchar *)(pcVar3 + lVar7);
      do {
        s2 = puVar6;
        if (local_38 == 0) goto LAB_007ec526;
        local_38 = local_38 + -1;
        puVar6 = s2 + 1;
      } while (*s2 == '\0');
      p1_local._4_4_ = (uint)*s2;
    }
    else {
LAB_007ec526:
      if ((p1->ext_len == 0) && (p2->ext_len == 0)) {
        p1_local._4_4_ = 0;
      }
      else if ((p1->ext_len == 2) && (p2->ext_len == 2)) {
        p1_local._4_4_ = 0;
      }
      else if (p1->ext_len < 3) {
        p1_local._4_4_ = 0xffffffff;
      }
      else if (p2->ext_len < 3) {
        p1_local._4_4_ = 1;
      }
      else {
        local_38 = p1->ext_len;
        if (p2->ext_len < local_38) {
          local_38 = p2->ext_len;
        }
        pcVar3 = p1->identifier;
        iVar1 = p1->ext_off;
        pcVar4 = p2->identifier;
        iVar2 = p2->ext_off;
        if ((local_38 < 2) ||
           (local_34 = memcmp(pcVar3 + iVar1,pcVar4 + iVar2,(long)local_38),
           p1_local._4_4_ = local_34, local_34 == 0)) {
          if (p1->ext_len < p2->ext_len) {
            lVar7 = (long)local_38;
            local_38 = p2->ext_len - p1->ext_len;
            pbVar5 = (byte *)(pcVar4 + iVar2 + lVar7);
            do {
              _l = pbVar5;
              if (local_38 == 0) goto LAB_007ec72b;
              local_38 = local_38 + -1;
              pbVar5 = _l + 1;
            } while (*_l == 0);
            p1_local._4_4_ = -(uint)*_l;
          }
          else if (p2->ext_len < p1->ext_len) {
            lVar7 = (long)local_38;
            local_38 = p1->ext_len - p2->ext_len;
            puVar6 = (uchar *)(pcVar3 + iVar1 + lVar7);
            do {
              s2 = puVar6;
              if (local_38 == 0) goto LAB_007ec72b;
              local_38 = local_38 + -1;
              puVar6 = s2 + 1;
            } while (*s2 == '\0');
            p1_local._4_4_ = (uint)*s2;
          }
          else {
LAB_007ec72b:
            p1_local._4_4_ = local_34;
          }
        }
      }
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int
isoent_cmp_joliet_identifier(const struct isoent *p1, const struct isoent *p2)
{
	const unsigned char *s1, *s2;
	int cmp;
	int l;

	s1 = (const unsigned char *)p1->identifier;
	s2 = (const unsigned char *)p2->identifier;

	/* Compare File Name */
	l = p1->ext_off;
	if (l > p2->ext_off)
		l = p2->ext_off;
	cmp = memcmp(s1, s2, l);
	if (cmp != 0)
		return (cmp);
	if (p1->ext_off < p2->ext_off) {
		s2 += l;
		l = p2->ext_off - p1->ext_off;
		while (l--)
			if (0 != *s2++)
				return (- *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_off > p2->ext_off) {
		s1 += l;
		l = p1->ext_off - p2->ext_off;
		while (l--)
			if (0 != *s1++)
				return (*(const unsigned char *)(s1 - 1));
	}
	/* Compare File Name Extension */
	if (p1->ext_len == 0 && p2->ext_len == 0)
		return (0);
	if (p1->ext_len == 2 && p2->ext_len == 2)
		return (0);
	if (p1->ext_len <= 2)
		return (-1);
	if (p2->ext_len <= 2)
		return (1);
	l = p1->ext_len;
	if (l > p2->ext_len)
		l = p2->ext_len;
	s1 = (unsigned char *)(p1->identifier + p1->ext_off);
	s2 = (unsigned char *)(p2->identifier + p2->ext_off);
	if (l > 1) {
		cmp = memcmp(s1, s2, l);
		if (cmp != 0)
			return (cmp);
	}
	if (p1->ext_len < p2->ext_len) {
		s2 += l;
		l = p2->ext_len - p1->ext_len;
		while (l--)
			if (0 != *s2++)
				return (- *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_len > p2->ext_len) {
		s1 += l;
		l = p1->ext_len - p2->ext_len;
		while (l--)
			if (0 != *s1++)
				return (*(const unsigned char *)(s1 - 1));
	}
	/* Compare File Version Number */
	/* No operation. The File Version Number is always one. */

	return (cmp);
}